

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void chunk(LexState *ls)

{
  unsigned_short *puVar1;
  Instruction *pIVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint first;
  TString *pTVar9;
  TString *pTVar10;
  FuncState *pFVar11;
  FuncState *fs;
  expdesc v;
  expdesc local_68;
  FuncState *local_50;
  TString *local_48;
  FuncState *local_40;
  FuncState *local_38;
  
  enterlevel(ls);
  bVar3 = false;
  while (!bVar3) {
    iVar4 = (ls->t).token;
    if ((iVar4 - 0x104U < 0x1c) && ((0x8010007U >> (iVar4 - 0x104U & 0x1f) & 1) != 0)) break;
    if (0x13 < iVar4 - 0x102U) {
switchD_0010a283_caseD_104:
      pFVar11 = ls->fs;
      primaryexp(ls,(expdesc *)&v.u.s);
      if (v.u.s.info == 0xd) {
        pIVar2 = pFVar11->f->code;
        pIVar2[v.t] = pIVar2[v.t] & 0xff803fff | 0x4000;
      }
      else {
        v.k = VVOID;
        v._4_4_ = 0;
        assignment(ls,(LHS_assign *)&v,1);
      }
      goto LAB_0010aa92;
    }
    iVar7 = ls->linenumber;
    switch(iVar4) {
    case 0x102:
      luaX_next(ls);
      breakstat(ls);
      bVar3 = true;
      break;
    case 0x103:
      luaX_next(ls);
      block(ls);
      check_match(ls,0x106,0x103,iVar7);
      goto LAB_0010aa92;
    default:
      goto switchD_0010a283_caseD_104;
    case 0x108:
      local_40 = ls->fs;
      local_68.u.s.info = -1;
      local_68.u.s.aux._0_1_ = local_40->nactvar;
      local_68.u.s.aux._1_2_ = 0x100;
      local_68._0_8_ = local_40->bl;
      local_40->bl = (BlockCnt *)&local_68;
      luaX_next(ls);
      pTVar9 = str_checkname(ls);
      iVar4 = (ls->t).token;
      if ((iVar4 == 0x2c) || (iVar4 == 0x10b)) {
        local_50 = ls->fs;
        local_48 = (TString *)CONCAT44(local_48._4_4_,local_50->freereg);
        pTVar10 = luaX_newstring(ls,"(for generator)",0xf);
        new_localvar(ls,pTVar10,0);
        pTVar10 = luaX_newstring(ls,"(for state)",0xb);
        new_localvar(ls,pTVar10,1);
        pTVar10 = luaX_newstring(ls,"(for control)",0xd);
        new_localvar(ls,pTVar10,2);
        new_localvar(ls,pTVar9,3);
        iVar4 = 4;
        while (iVar5 = testnext(ls,0x2c), iVar5 != 0) {
          pTVar9 = str_checkname(ls);
          new_localvar(ls,pTVar9,iVar4);
          iVar4 = iVar4 + 1;
        }
        checknext(ls,0x10b);
        iVar5 = ls->linenumber;
        iVar6 = explist1(ls,&v);
        adjust_assign(ls,3,iVar6,&v);
        luaK_checkstack(local_50,3);
        forbody(ls,(int)local_48,iVar5,iVar4 + -3,0);
        pFVar11 = local_40;
      }
      else {
        local_48 = pTVar9;
        if (iVar4 != 0x3d) {
          luaX_syntaxerror(ls,"\'=\' or \'in\' expected");
        }
        local_38 = ls->fs;
        local_50 = (FuncState *)CONCAT44(local_50._4_4_,local_38->freereg);
        pTVar9 = luaX_newstring(ls,"(for index)",0xb);
        new_localvar(ls,pTVar9,0);
        pTVar9 = luaX_newstring(ls,"(for limit)",0xb);
        new_localvar(ls,pTVar9,1);
        pTVar9 = luaX_newstring(ls,"(for step)",10);
        new_localvar(ls,pTVar9,2);
        new_localvar(ls,local_48,3);
        checknext(ls,0x3d);
        exp1(ls);
        checknext(ls,0x2c);
        exp1(ls);
        iVar4 = testnext(ls,0x2c);
        pFVar11 = local_38;
        if (iVar4 == 0) {
          iVar4 = local_38->freereg;
          uVar8 = luaK_numberK(local_38,1.0);
          luaK_codeABx(pFVar11,OP_LOADK,iVar4,uVar8);
          luaK_reserveregs(pFVar11,1);
        }
        else {
          exp1(ls);
        }
        pFVar11 = local_40;
        forbody(ls,(int)local_50,iVar7,1,1);
      }
      check_match(ls,0x106,0x108,iVar7);
      leaveblock(pFVar11);
      goto LAB_0010aa92;
    case 0x109:
      luaX_next(ls);
      singlevar(ls,&v);
      while (iVar4 = (ls->t).token, iVar4 == 0x2e) {
        field(ls,&v);
      }
      if (iVar4 == 0x3a) {
        field(ls,&v);
      }
      body(ls,&local_68,(uint)(iVar4 == 0x3a),iVar7);
      luaK_storevar(ls->fs,&v,&local_68);
      ls->fs->f->lineinfo[(long)ls->fs->pc + -1] = iVar7;
      goto LAB_0010aa92;
    case 0x10a:
      pFVar11 = ls->fs;
      v.k = ~VVOID;
      while( true ) {
        luaX_next(ls);
        iVar5 = cond(ls);
        checknext(ls,0x112);
        block(ls);
        iVar4 = (ls->t).token;
        if (iVar4 != 0x105) break;
        iVar4 = luaK_jump(pFVar11);
        luaK_concat(pFVar11,(int *)&v,iVar4);
        luaK_patchtohere(pFVar11,iVar5);
      }
      if (iVar4 == 0x104) {
        iVar4 = luaK_jump(pFVar11);
        luaK_concat(pFVar11,(int *)&v,iVar4);
        luaK_patchtohere(pFVar11,iVar5);
        luaX_next(ls);
        block(ls);
      }
      else {
        luaK_concat(pFVar11,(int *)&v,iVar5);
      }
      luaK_patchtohere(pFVar11,v.k);
      check_match(ls,0x106,0x10a,iVar7);
      bVar3 = false;
      break;
    case 0x10c:
      luaX_next(ls);
      iVar4 = testnext(ls,0x109);
      if (iVar4 == 0) {
        iVar4 = 0;
        do {
          pTVar9 = str_checkname(ls);
          iVar5 = iVar4 + 1;
          new_localvar(ls,pTVar9,iVar4);
          iVar7 = testnext(ls,0x2c);
          iVar4 = iVar5;
        } while (iVar7 != 0);
        iVar4 = testnext(ls,0x3d);
        if (iVar4 == 0) {
          v._0_8_ = v._0_8_ & 0xffffffff00000000;
          iVar4 = 0;
        }
        else {
          iVar4 = explist1(ls,&v);
        }
        adjust_assign(ls,iVar5,iVar4,&v);
        adjustlocalvars(ls,iVar5);
        goto LAB_0010aa92;
      }
      pFVar11 = ls->fs;
      pTVar9 = str_checkname(ls);
      bVar3 = false;
      new_localvar(ls,pTVar9,0);
      v.u.s.info = pFVar11->freereg;
      v.t = -1;
      v.f = -1;
      v.k = VLOCAL;
      luaK_reserveregs(pFVar11,1);
      adjustlocalvars(ls,1);
      body(ls,&local_68,0,ls->linenumber);
      luaK_storevar(pFVar11,&v,&local_68);
      pFVar11->f->locvars[*(ushort *)&pFVar11->upvalues[(ulong)pFVar11->nactvar + 0x3b].info].
      startpc = pFVar11->pc;
      break;
    case 0x110:
      pFVar11 = ls->fs;
      iVar4 = pFVar11->pc;
      pFVar11->lasttarget = iVar4;
      v.u.s.info = -1;
      v.u.s.aux._2_1_ = 1;
      v.u.s.aux._0_1_ = pFVar11->nactvar;
      v.u.s.aux._1_1_ = 0;
      v._0_8_ = pFVar11->bl;
      local_68.u.s.info = -1;
      local_68.u.s.aux._1_2_ = 0;
      pFVar11->bl = (BlockCnt *)&local_68;
      local_68._0_8_ = &v;
      local_68.u.s.aux._0_1_ = v.u.s.aux._0_1_;
      luaX_next(ls);
      chunk(ls);
      check_match(ls,0x114,0x110,iVar7);
      iVar7 = cond(ls);
      if (local_68.u.s.aux._1_1_ == '\0') {
        leaveblock(pFVar11);
        fs = ls->fs;
      }
      else {
        breakstat(ls);
        luaK_patchtohere(ls->fs,iVar7);
        leaveblock(pFVar11);
        fs = ls->fs;
        iVar7 = luaK_jump(pFVar11);
      }
      luaK_patchlist(fs,iVar7,iVar4);
      leaveblock(pFVar11);
      bVar3 = false;
      break;
    case 0x111:
      pFVar11 = ls->fs;
      luaX_next(ls);
      iVar4 = (ls->t).token;
      first = 0;
      uVar8 = iVar4 - 0x104;
      if ((uVar8 < 0x1c) && ((0x8010007U >> (uVar8 & 0x1f) & 1) != 0)) {
        first = 0;
        iVar7 = 0;
      }
      else {
        iVar7 = 0;
        if (iVar4 != 0x3b) {
          iVar7 = explist1(ls,&v);
          if (v.k - VCALL < 2) {
            luaK_setreturns(pFVar11,&v,-1);
            if (iVar7 == 1 && v.k == VCALL) {
              pIVar2 = pFVar11->f->code;
              pIVar2[v.u.s.info] = pIVar2[v.u.s.info] & 0xffffffc0 | 0x1d;
            }
            first = (uint)pFVar11->nactvar;
            iVar7 = -1;
          }
          else if (iVar7 == 1) {
            first = luaK_exp2anyreg(pFVar11,&v);
            iVar7 = 1;
          }
          else {
            luaK_exp2nextreg(pFVar11,&v);
            first = (uint)pFVar11->nactvar;
          }
        }
      }
      luaK_ret(pFVar11,first,iVar7);
      bVar3 = true;
      break;
    case 0x115:
      pFVar11 = ls->fs;
      luaX_next(ls);
      iVar4 = pFVar11->pc;
      pFVar11->lasttarget = iVar4;
      iVar5 = cond(ls);
      v.u.s.info = -1;
      v.u.s.aux._2_1_ = 1;
      v.u.s.aux._0_1_ = pFVar11->nactvar;
      v.u.s.aux._1_1_ = 0;
      v._0_8_ = pFVar11->bl;
      pFVar11->bl = (BlockCnt *)&v;
      checknext(ls,0x103);
      block(ls);
      iVar6 = luaK_jump(pFVar11);
      luaK_patchlist(pFVar11,iVar6,iVar4);
      check_match(ls,0x106,0x115,iVar7);
      leaveblock(pFVar11);
      luaK_patchtohere(pFVar11,iVar5);
LAB_0010aa92:
      bVar3 = false;
    }
    testnext(ls,0x3b);
    ls->fs->freereg = (uint)ls->fs->nactvar;
  }
  puVar1 = &ls->L->nCcalls;
  *puVar1 = *puVar1 - 1;
  return;
}

Assistant:

static void chunk(LexState*ls){
int islast=0;
enterlevel(ls);
while(!islast&&!block_follow(ls->t.token)){
islast=statement(ls);
testnext(ls,';');
ls->fs->freereg=ls->fs->nactvar;
}
leavelevel(ls);
}